

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

Info * __thiscall CMU462::Edge::getInfo_abi_cxx11_(Info *__return_storage_ptr__,Edge *this)

{
  bool bVar1;
  ostream *poVar2;
  HalfedgeIter *pHVar3;
  Halfedge *pHVar4;
  char *pcVar5;
  value_type local_6d8;
  value_type local_6b8;
  value_type local_698;
  value_type local_678;
  value_type local_658;
  value_type local_638;
  _List_node_base *local_618;
  ostringstream local_610 [8];
  ostringstream m4;
  ostringstream local_498 [8];
  ostringstream m3;
  ostringstream local_320 [8];
  ostringstream m2;
  ostringstream local_198 [8];
  ostringstream m1;
  Edge *this_local;
  Info *info;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::__cxx11::ostringstream::ostringstream(local_498);
  std::__cxx11::ostringstream::ostringstream(local_610);
  std::operator<<((ostream *)local_198,"EDGE");
  poVar2 = std::operator<<((ostream *)local_320,"Address: ");
  std::ostream::operator<<(poVar2,this);
  poVar2 = std::operator<<((ostream *)local_498,"Halfedge: ");
  pHVar3 = halfedge(this);
  local_618 = pHVar3->_M_node;
  pHVar4 = elementAddress((HalfedgeIter)local_618);
  std::ostream::operator<<(poVar2,pHVar4);
  poVar2 = std::operator<<((ostream *)local_610,"Boundary: ");
  bVar1 = isBoundary(this);
  pcVar5 = "NO";
  if (bVar1) {
    pcVar5 = "YES";
  }
  std::operator<<(poVar2,pcVar5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,4);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_638);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::string((string *)&local_658);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_658);
  std::__cxx11::string::~string((string *)&local_658);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_678);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_698);
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::string((string *)&local_6b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_6b8);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_6d8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::__cxx11::ostringstream::~ostringstream(local_610);
  std::__cxx11::ostringstream::~ostringstream(local_498);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

Info Edge::getInfo()
  {
    Info info;

    ostringstream m1, m2, m3, m4;
    m1 << "EDGE";
    m2 << "Address: "  << this;
    m3 << "Halfedge: " << elementAddress(halfedge());
    m4 << "Boundary: " << (isBoundary() ? "YES" : "NO");

    info.reserve(4);
    info.push_back(m1.str());
    info.push_back(string());
    info.push_back(m2.str());
    info.push_back(m3.str());
    info.push_back(string());
    info.push_back(m4.str());

    return info;
  }